

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::meshsurface(tetgenmesh *this)

{
  uint *puVar1;
  uint uVar2;
  facet *pfVar3;
  int *piVar4;
  point pdVar5;
  char **ppcVar6;
  tetgenbehavior *ptVar7;
  bool bVar8;
  point *ppdVar9;
  arraypool *this_00;
  arraypool *this_01;
  tetgenio *ptVar10;
  char *pcVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  polygon *ppVar15;
  polygon *ppVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  point *idx2verlist;
  point local_50;
  point *local_48;
  char ***local_40;
  point local_38;
  
  if (this->b->quiet == 0) {
    puts("Creating surface mesh ...");
  }
  makeindex2pointmap(this,&local_48);
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 8;
  this_00->objectsperblock = 0x100;
  this_00->log2objectsperblock = 8;
  this_00->objectsperblockmark = 0xff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  this_01 = (arraypool *)operator_new(0x30);
  ppdVar9 = local_48;
  this_01->objectbytes = 0x10;
  this_01->objectsperblock = 0x100;
  this_01->log2objectsperblock = 8;
  this_01->objectsperblockmark = 0xff;
  this_01->toparraylen = 0;
  this_01->toparray = (char **)0x0;
  this_01->objects = 0;
  this_01->totalmemory = 0;
  ptVar10 = this->in;
  if (0 < ptVar10->numberoffacets) {
    local_40 = &this_00->toparray;
    lVar21 = 1;
    do {
      pfVar3 = ptVar10->facetlist;
      if ((0 < this->dupverts) && (0 < pfVar3[lVar21 + -1].numberofpolygons)) {
        ppVar16 = pfVar3[lVar21 + -1].polygonlist;
        lVar14 = 0;
        do {
          if (0 < ppVar16[lVar14].numberofvertices) {
            ppVar15 = ppVar16 + lVar14;
            piVar4 = ppVar15->vertexlist;
            lVar20 = 0;
            do {
              if ((*(uint *)((long)ppdVar9[piVar4[lVar20]] + (long)this->pointmarkindex * 4 + 4) &
                  0xffffff00) == 0x100) {
                piVar4[lVar20] =
                     *(int *)((long)ppdVar9[piVar4[lVar20]][(long)this->point2simindex + 1] +
                             (long)this->pointmarkindex * 4);
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < ppVar15->numberofvertices);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < pfVar3[lVar21 + -1].numberofpolygons);
      }
      if (0 < pfVar3[lVar21 + -1].numberofpolygons) {
        lVar14 = 0;
        do {
          ppVar16 = pfVar3[lVar21 + -1].polygonlist;
          uVar17 = *ppVar16[lVar14].vertexlist;
          iVar18 = this->in->firstnumber;
          if (((int)uVar17 < iVar18) || (iVar18 + this->in->numberofpoints <= (int)uVar17)) {
            if (this->b->quiet == 0) {
              printf("Warning:  Invalid the 1st vertex %d of polygon");
              printf(" %d in facet %d.\n",(ulong)((int)lVar14 + 1),lVar21);
            }
          }
          else {
            local_50 = ppdVar9[(int)uVar17];
            uVar13 = *(uint *)((long)local_50 + (long)this->pointmarkindex * 4 + 4);
            if ((uVar13 & 1) == 0) {
              *(uint *)((long)local_50 + (long)this->pointmarkindex * 4 + 4) = uVar13 | 1;
              pcVar11 = arraypool::getblock(this_00,(int)this_00->objects);
              uVar12 = this_00->objects;
              this_00->objects = uVar12 + 1;
              *(point *)(pcVar11 +
                        (long)this_00->objectbytes * ((long)this_00->objectsperblock - 1U & uVar12))
                   = local_50;
            }
            ppVar16 = ppVar16 + lVar14;
            uVar12 = (ulong)(uint)ppVar16->numberofvertices;
            if (0 < ppVar16->numberofvertices) {
              uVar13 = (int)lVar14 + 1;
              lVar20 = 1;
              do {
                lVar19 = 0;
                if (lVar20 < (int)uVar12) {
                  lVar19 = lVar20;
                }
                uVar2 = ppVar16->vertexlist[lVar19];
                iVar18 = this->in->firstnumber;
                if (((int)uVar2 < iVar18) || (iVar18 + this->in->numberofpoints <= (int)uVar2)) {
                  if (this->b->quiet == 0) {
                    printf("Warning:  Invalid vertex %d in polygon %d",(ulong)uVar2,(ulong)uVar13);
LAB_001318e2:
                    printf(" in facet %d.\n",lVar21);
                  }
                }
                else if (uVar17 == uVar2) {
                  if ((2 < (int)uVar12) && (this->b->quiet == 0)) {
                    printf("Warning:  Polygon %d has two identical verts",(ulong)uVar13);
                    goto LAB_001318e2;
                  }
                }
                else {
                  pdVar5 = ppdVar9[(int)uVar2];
                  uVar17 = *(uint *)((long)pdVar5 + (long)this->pointmarkindex * 4 + 4);
                  if ((uVar17 & 1) == 0) {
                    *(uint *)((long)pdVar5 + (long)this->pointmarkindex * 4 + 4) = uVar17 | 1;
                    pcVar11 = arraypool::getblock(this_00,(int)this_00->objects);
                    uVar12 = this_00->objects;
                    this_00->objects = uVar12 + 1;
                    *(point *)(pcVar11 +
                              (long)this_00->objectbytes *
                              ((long)this_00->objectsperblock - 1U & uVar12)) = pdVar5;
                  }
                  local_38 = pdVar5;
                  pcVar11 = arraypool::getblock(this_01,(int)this_01->objects);
                  lVar19 = (long)this_01->objectbytes *
                           ((long)this_01->objectsperblock - 1U & this_01->objects);
                  this_01->objects = this_01->objects + 1;
                  *(point *)(pcVar11 + lVar19) = local_50;
                  *(point *)(pcVar11 + lVar19 + 8) = local_38;
                  local_50 = local_38;
                  uVar17 = uVar2;
                }
                if (ppVar16->numberofvertices == 2) break;
                uVar12 = (ulong)ppVar16->numberofvertices;
                bVar8 = lVar20 < (long)uVar12;
                lVar20 = lVar20 + 1;
              } while (bVar8);
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < pfVar3[lVar21 + -1].numberofpolygons);
      }
      lVar14 = this_00->objects;
      if (0 < lVar14) {
        ppcVar6 = *local_40;
        lVar20 = 0;
        do {
          puVar1 = (uint *)(*(long *)(ppcVar6[(uint)lVar20 >>
                                              ((byte)this_00->log2objectsperblock & 0x1f)] +
                                     (long)this_00->objectbytes *
                                     (long)(int)(this_00->objectsperblockmark & (uint)lVar20)) + 4 +
                           (long)this->pointmarkindex * 4);
          *puVar1 = *puVar1 & 0xfffffffe;
          lVar20 = lVar20 + 1;
        } while (lVar14 != lVar20);
      }
      piVar4 = this->in->facetmarkerlist;
      if (piVar4 == (int *)0x0) {
        iVar18 = -1;
      }
      else {
        iVar18 = piVar4[lVar21 + -1];
      }
      triangulate(this,iVar18,this_00,this_01,pfVar3[lVar21 + -1].numberofholes,
                  pfVar3[lVar21 + -1].holelist);
      this_00->objects = 0;
      this_01->objects = 0;
      ptVar10 = this->in;
      bVar8 = lVar21 < ptVar10->numberoffacets;
      lVar21 = lVar21 + 1;
    } while (bVar8);
  }
  if (this->b->diagnose == 0) {
    unifysegments(this);
    if (0 < this->in->numberofedges) {
      identifyinputedges(this,local_48);
    }
    ptVar7 = this->b;
    if (((ptVar7->psc == 0) && (ptVar7->nomergefacet == 0)) &&
       ((ptVar7->nobisect == 0 || (ptVar7->nobisect_nomerge == 0)))) {
      mergefacets(this);
    }
  }
  if (this->b->object == STL) {
    jettisonnodes(this);
  }
  if (this->b->verbose != 0) {
    printf("  %ld (%ld) subfaces (segments).\n",this->subfaces->items,this->subsegs->items);
  }
  this->insegments = this->subsegs->items;
  if (local_48 != (point *)0x0) {
    operator_delete__(local_48);
  }
  arraypool::~arraypool(this_00);
  operator_delete(this_00,0x30);
  arraypool::~arraypool(this_01);
  operator_delete(this_01,0x30);
  return;
}

Assistant:

void tetgenmesh::meshsurface()
{
  arraypool *ptlist, *conlist;
  point *idx2verlist;
  point tstart, tend, *pnewpt, *cons;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  int end1, end2;
  int shmark, i, j;

  if (!b->quiet) {
    printf("Creating surface mesh ...\n");
  }

  // Create a map from indices to points.
  makeindex2pointmap(idx2verlist);

  // Initialize arrays (block size: 2^8 = 256).
  ptlist = new arraypool(sizeof(point *), 8);
  conlist = new arraypool(2 * sizeof(point *), 8);

  // Loop the facet list, triangulate each facet.
  for (shmark = 1; shmark <= in->numberoffacets; shmark++) {

    // Get a facet F.
    f = &in->facetlist[shmark - 1];

    // Process the duplicated points first, they are marked with type
    //   DUPLICATEDVERTEX.  If p and q are duplicated, and p'index > q's,
    //   then p is substituted by q.
    if (dupverts > 0l) {
      // Loop all polygons of this facet.
      for (i = 0; i < f->numberofpolygons; i++) {
        p = &(f->polygonlist[i]);
        // Loop other vertices of this polygon.
        for (j = 0; j < p->numberofvertices; j++) {
          end1 = p->vertexlist[j];
          tstart = idx2verlist[end1];
          if (pointtype(tstart) == DUPLICATEDVERTEX) {
            // Reset the index of vertex-j.
            tend = point2ppt(tstart);
            end2 = pointmark(tend);
            p->vertexlist[j] = end2;
          }
        }
      }
    }

    // Loop polygons of F, get the set of vertices and segments.
    for (i = 0; i < f->numberofpolygons; i++) {
      // Get a polygon.
      p = &(f->polygonlist[i]);
      // Get the first vertex.
      end1 = p->vertexlist[0];
      if ((end1 < in->firstnumber) || 
          (end1 >= in->firstnumber + in->numberofpoints)) {
        if (!b->quiet) {
          printf("Warning:  Invalid the 1st vertex %d of polygon", end1);
          printf(" %d in facet %d.\n", i + 1, shmark);
        }
        continue; // Skip this polygon.
      }
      tstart = idx2verlist[end1];
      // Add tstart to V if it haven't been added yet.
      if (!pinfected(tstart)) {
        pinfect(tstart);
        ptlist->newindex((void **) &pnewpt);
        *pnewpt = tstart;
      }
      // Loop other vertices of this polygon.
      for (j = 1; j <= p->numberofvertices; j++) {
        // get a vertex.
        if (j < p->numberofvertices) {
          end2 = p->vertexlist[j];
        } else {
          end2 = p->vertexlist[0];  // Form a loop from last to first.
        }
        if ((end2 < in->firstnumber) ||
            (end2 >= in->firstnumber + in->numberofpoints)) {
          if (!b->quiet) {
            printf("Warning:  Invalid vertex %d in polygon %d", end2, i + 1);
            printf(" in facet %d.\n", shmark);
          }
        } else {
          if (end1 != end2) {
            // 'end1' and 'end2' form a segment.
            tend = idx2verlist[end2];
            // Add tstart to V if it haven't been added yet.
            if (!pinfected(tend)) {
              pinfect(tend);
              ptlist->newindex((void **) &pnewpt);
              *pnewpt = tend;
            }
            // Save the segment in S (conlist).
            conlist->newindex((void **) &cons);
            cons[0] = tstart;
            cons[1] = tend;
            // Set the start for next continuous segment.
            end1 = end2;
            tstart = tend;
          } else {
            // Two identical vertices mean an isolated vertex of F.
            if (p->numberofvertices > 2) {
              // This may be an error in the input, anyway, we can continue
              //   by simply skipping this segment.
              if (!b->quiet) {
                printf("Warning:  Polygon %d has two identical verts", i + 1);
                printf(" in facet %d.\n", shmark);
              }
            } 
            // Ignore this vertex.
          }
        }
        // Is the polygon degenerate (a segment or a vertex)?
        if (p->numberofvertices == 2) break;
      }
    }
    // Unmark vertices.
    for (i = 0; i < ptlist->objects; i++) {
      pnewpt = (point *) fastlookup(ptlist, i);
      puninfect(*pnewpt);
    }

    // Triangulate F into a CDT.
    // If in->facetmarklist is NULL, use the default marker -1. 
    triangulate(in->facetmarkerlist ? in->facetmarkerlist[shmark - 1] : -1,
                ptlist, conlist, f->numberofholes, f->holelist);

    // Clear working lists.
    ptlist->restart();
    conlist->restart();
  }

  if (!b->diagnose) {
    // Remove redundant segments and build the face links.
    unifysegments();
    if (in->numberofedges > 0) { 
      // There are input segments. Insert them.
      identifyinputedges(idx2verlist);
    }
    if (!b->psc && !b->nomergefacet && 
        (!b->nobisect || (b->nobisect && !b->nobisect_nomerge))) {
      // Merge coplanar facets.
      mergefacets();
    }
  }

  if (b->object == tetgenbehavior::STL) {
    // Remove redundant vertices (for .stl input mesh).
    jettisonnodes();
  }

  if (b->verbose) {
    printf("  %ld (%ld) subfaces (segments).\n", subfaces->items, 
           subsegs->items);
  }

  // The total number of iunput segments.
  insegments = subsegs->items;

  delete [] idx2verlist;
  delete ptlist;
  delete conlist;
}